

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall
flatbuffers::ServiceDef::Deserialize(ServiceDef *this,Parser *parser,Service *service)

{
  bool bVar1;
  String *this_00;
  Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int> *pVVar2;
  RPCCall *this_01;
  return_type call;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  uoffset_t i;
  uint i_00;
  string local_70;
  string local_50;
  
  this_00 = reflection::Service::name(service);
  String::str_abi_cxx11_(&local_70,this_00);
  Parser::UnqualifiedName(&local_50,parser,&local_70);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pVVar2 = reflection::Service::calls(service);
  if (pVVar2 == (Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int> *)0x0) {
LAB_00117d50:
    attrs = reflection::Service::attributes(service);
    bVar1 = DeserializeAttributesCommon(&(this->super_Definition).attributes,parser,attrs);
    if (bVar1) {
      documentation = reflection::Service::documentation(service);
      anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
      return true;
    }
  }
  else {
    i_00 = 0;
    do {
      pVVar2 = reflection::Service::calls(service);
      if (*(uint *)pVVar2 <= i_00) goto LAB_00117d50;
      this_01 = (RPCCall *)operator_new(0xd8);
      memset(this_01,0,0xd8);
      Definition::Definition((Definition *)this_01);
      pVVar2 = reflection::Service::calls(service);
      call = Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int>::Get(pVVar2,i_00);
      bVar1 = RPCCall::Deserialize(this_01,parser,call);
      if (!bVar1) break;
      bVar1 = SymbolTable<flatbuffers::RPCCall>::Add(&this->calls,(string *)this_01,this_01);
      i_00 = i_00 + 1;
    } while (!bVar1);
    Definition::~Definition((Definition *)this_01);
    operator_delete(this_01,0xd8);
  }
  return false;
}

Assistant:

bool ServiceDef::Deserialize(Parser &parser,
                             const reflection::Service *service) {
  name = parser.UnqualifiedName(service->name()->str());
  if (service->calls()) {
    for (uoffset_t i = 0; i < service->calls()->size(); ++i) {
      auto call = new RPCCall();
      if (!call->Deserialize(parser, service->calls()->Get(i)) ||
          calls.Add(call->name, call)) {
        delete call;
        return false;
      }
    }
  }
  if (!DeserializeAttributes(parser, service->attributes())) return false;
  DeserializeDoc(doc_comment, service->documentation());
  return true;
}